

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tracker_connection.cpp
# Opt level: O1

void __thiscall libtorrent::aux::http_tracker_connection::start(http_tracker_connection *this)

{
  _Atomic_word *p_Var1;
  mutex *pmVar2;
  event_t eVar3;
  pointer pcVar4;
  session_settings *this_00;
  i2p_connection *piVar5;
  pointer paVar6;
  address_v6 *paVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  io_context *__args;
  resolver_interface *__args_1;
  http_connection *this_01;
  _WordT _Var9;
  http_tracker_connection *phVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  ulong uVar15;
  long *plVar16;
  undefined8 *puVar17;
  uint *puVar18;
  char *__s;
  string *psVar19;
  listen_socket_t *plVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RCX;
  ulong uVar21;
  address_v6 *this_02;
  proxy_settings *ps_00;
  int iVar22;
  pointer __cp;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view query_string;
  bool local_589;
  shared_ptr<libtorrent::aux::request_callback> cb;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578 [3];
  bool local_548;
  http_tracker_connection *local_540;
  undefined1 local_531;
  string url;
  listen_socket_handle ls;
  bind_info_t bi;
  int local_4ac;
  string user_agent;
  undefined1 local_488 [32];
  undefined1 local_468 [24];
  undefined1 auStack_450 [16];
  _Alloc_hider _Stack_440;
  proxy_settings ps;
  
  url._M_dataplus._M_p = (pointer)&url.field_2;
  pcVar4 = (this->super_tracker_connection).m_req.url._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&url,pcVar4,
             pcVar4 + (this->super_tracker_connection).m_req.url._M_string_length);
  if (((this->super_tracker_connection).m_req.kind.m_val & 1) != 0) {
    uVar15 = ::std::__cxx11::string::find((char *)&url,0x3fa058,0);
    if (uVar15 == 0xffffffffffffffff) {
      ps.hostname._0_16_ = errors::make_error_code(scrape_not_available);
      tracker_connection::fail
                (&this->super_tracker_connection,(error_code *)&ps,bittorrent,"",(seconds32)0x0,
                 (seconds32)0x0);
      goto LAB_0021385f;
    }
    in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3fae55;
    ::std::__cxx11::string::replace((ulong)&url,uVar15,(char *)0x8,0x3fae55);
  }
  bVar13 = is_i2p_url((string *)&url);
  this_00 = ((this->super_tracker_connection).m_man)->m_settings;
  uVar15 = ::std::__cxx11::string::find((char)&url,0x3f);
  local_540 = this;
  if (uVar15 == 0xffffffffffffffff) {
    ::std::__cxx11::string::append((char *)&url);
  }
  else {
    ps.hostname._M_string_length._0_1_ = 0;
    ps.hostname._M_dataplus._M_p = (pointer)&this_00->m_mutex;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&ps);
    ps.hostname._M_string_length._0_1_ = 1;
    _Var9 = (this_00->m_store).m_bools.super__Base_bitset<2UL>._M_w[1];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&ps);
    if (((uint)_Var9 >> 0x10 & 1) != 0) {
      if (CONCAT44(url._M_string_length._4_4_,(int)url._M_string_length) <= uVar15) {
        ::std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
      }
      in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(CONCAT44(url._M_string_length._4_4_,(int)url._M_string_length) - (uVar15 + 1));
      query_string._M_str = url._M_dataplus._M_p + uVar15 + 1;
      query_string._M_len = (size_t)in_RCX;
      bVar14 = has_tracker_query_string(query_string);
      if (bVar14) {
        ps.hostname._0_16_ = errors::make_error_code(ssrf_mitigation);
        tracker_connection::fail
                  (&local_540->super_tracker_connection,(error_code *)&ps,bittorrent,"",
                   (seconds32)0x0,(seconds32)0x0);
        goto LAB_0021385f;
      }
    }
    ::std::__cxx11::string::append((char *)&url);
    this = local_540;
  }
  ::std::__cxx11::string::append((char *)&url);
  str._M_str = (char *)in_RCX;
  str._M_len = (size_t)&(this->super_tracker_connection).m_req.info_hash;
  escape_string_abi_cxx11_(&ps.hostname,(libtorrent *)0x14,str);
  ::std::__cxx11::string::_M_append((char *)&url,(ulong)ps.hostname._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ps.hostname._M_dataplus._M_p != &ps.hostname.field_2) {
    operator_delete(ps.hostname._M_dataplus._M_p,ps.hostname.field_2._M_allocated_capacity + 1);
  }
  if (((this->super_tracker_connection).m_req.kind.m_val & 1) == 0) {
    str_00._M_str = (char *)in_RCX;
    str_00._M_len = (size_t)&(this->super_tracker_connection).m_req.pid;
    escape_string_abi_cxx11_((string *)&cb,(libtorrent *)0x14,str_00);
    in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    snprintf((char *)&ps,0x400,
             "&peer_id=%s&port=%d&uploaded=%ld&downloaded=%ld&left=%ld&corrupt=%ld&key=%08X%s%s&numwant=%d&compact=1&no_peer_id=1"
            );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != local_578) {
      operator_delete(cb.
                      super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_578[0]._M_allocated_capacity + 1);
    }
    ::std::__cxx11::string::append((char *)&url);
    pmVar2 = &this_00->m_mutex;
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._0_1_ = 0;
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pmVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&cb);
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._0_1_ = 1;
    iVar22 = (this_00->m_store).m_ints._M_elems[0x77];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&cb);
    this = local_540;
    if (iVar22 != 2) {
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_1_ = 0;
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pmVar2;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&cb);
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_1_ = 1;
      uVar15 = (this_00->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&cb);
      if ((uVar15 >> 0x3a & 1) != 0) {
        ::std::__cxx11::string::append((char *)&url);
      }
    }
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._0_1_ = 0;
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pmVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&cb);
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._0_1_ = 1;
    uVar15 = (this_00->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&cb);
    if ((uVar15 >> 0x37 & 1) != 0) {
      ::std::__cxx11::string::append((char *)&url);
      to_string((array<char,_22UL> *)&cb,(this->super_tracker_connection).m_req.redundant);
      ::std::__cxx11::string::append((char *)&url);
    }
    if ((this->super_tracker_connection).m_req.trackerid._M_string_length != 0) {
      ::std::__cxx11::string::append((char *)&url);
      str_01._M_str = (char *)in_RCX;
      str_01._M_len = (size_t)(this->super_tracker_connection).m_req.trackerid._M_dataplus._M_p;
      escape_string_abi_cxx11_
                ((string *)&cb,
                 (libtorrent *)(this->super_tracker_connection).m_req.trackerid._M_string_length,
                 str_01);
      ::std::__cxx11::string::_M_append
                ((char *)&url,
                 (ulong)cb.
                        super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != local_578) {
        operator_delete(cb.
                        super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_578[0]._M_allocated_capacity + 1);
      }
    }
    if ((bVar13) &&
       (piVar5 = (this->super_tracker_connection).m_req.i2pconn, piVar5 != (i2p_connection *)0x0)) {
      if ((piVar5->m_i2p_local_endpoint)._M_string_length == 0) {
        cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)
             errors::make_error_code(no_i2p_endpoint);
        tracker_connection::fail
                  (&this->super_tracker_connection,(error_code *)&cb,bittorrent,
                   "Waiting for i2p acceptor from SAM bridge",(seconds32)0x5,(seconds32)0x0);
        goto LAB_0021385f;
      }
      ::std::operator+(&bi.device,"&ip=",&piVar5->m_i2p_local_endpoint);
      plVar16 = (long *)::std::__cxx11::string::append((char *)&bi);
      in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 == in_RCX) {
        local_578[0]._0_8_ = in_RCX->_M_allocated_capacity;
        local_578[0]._8_8_ = plVar16[3];
        cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_578;
      }
      else {
        local_578[0]._0_8_ = in_RCX->_M_allocated_capacity;
        cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)*plVar16;
      }
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar16[1];
      *plVar16 = (long)in_RCX;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)&url,
                 (ulong)cb.
                        super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    }
    else {
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_1_ = 0;
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pmVar2;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&cb);
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_1_ = 1;
      uVar15 = (this_00->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&cb);
      if (((uVar15 >> 0x26 & 1) != 0) ||
         (psVar19 = session_settings::get_str_abi_cxx11_(this_00,1), psVar19->_M_string_length == 0)
         ) goto LAB_00212ef2;
      str_02._M_str = (char *)in_RCX;
      str_02._M_len = (size_t)(psVar19->_M_dataplus)._M_p;
      escape_string_abi_cxx11_(&bi.device,(libtorrent *)psVar19->_M_string_length,str_02);
      puVar17 = (undefined8 *)::std::__cxx11::string::replace((ulong)&bi,0,(char *)0x0,0x3ec17b);
      in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 == in_RCX) {
        local_578[0]._0_8_ = in_RCX->_M_allocated_capacity;
        local_578[0]._8_8_ = puVar17[3];
        cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_578;
      }
      else {
        local_578[0]._0_8_ = in_RCX->_M_allocated_capacity;
        cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)*puVar17;
      }
      cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar17[1];
      *puVar17 = in_RCX;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)&url,
                 (ulong)cb.
                        super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != local_578) {
      operator_delete(cb.
                      super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_578[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bi.device._M_dataplus._M_p != &bi.device.field_2) {
      operator_delete(bi.device._M_dataplus._M_p,bi.device.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00212ef2:
  __cp = (this->super_tracker_connection).m_req.ipv4.
         super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
         ._M_impl.super__Vector_impl_data._M_start;
  paVar6 = (this->super_tracker_connection).m_req.ipv4.
           super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__cp != paVar6 && !bVar13) {
    puVar18 = (uint *)__errno_location();
    do {
      *puVar18 = 0;
      __s = inet_ntop(2,__cp,(char *)&bi,0x10);
      in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)*puVar18;
      uVar15 = 0x100000000;
      if (in_RCX == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        uVar15 = 0;
      }
      uVar21 = 0x100000016;
      if (in_RCX != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        uVar21 = uVar15 | (ulong)in_RCX;
      }
      if ((__s == (char *)0x0) &&
         (in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar21 >> 0x20),
         in_RCX != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0)) {
        ::std::runtime_error::runtime_error((runtime_error *)&ps,"");
        ps.username._M_dataplus._M_p = (pointer)&ps.username.field_2;
        ps.hostname._M_dataplus._M_p = (pointer)&PTR__system_error_004ee4b8;
        ps.hostname.field_2._8_8_ =
             &boost::system::detail::cat_holder<void>::system_category_instance;
        ps.username._M_string_length = 0;
        ps.username.field_2._M_local_buf[0] = '\0';
        ps.hostname.field_2._M_allocated_capacity = uVar21;
        boost::throw_exception<boost::system::system_error>((system_error *)&ps);
      }
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&cb,__s,(allocator<char> *)&ps)
      ;
      ::std::__cxx11::string::append((char *)&url);
      str_03._M_str = (char *)in_RCX;
      str_03._M_len =
           (size_t)cb.
                   super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
      escape_string_abi_cxx11_
                (&ps.hostname,
                 (libtorrent *)
                 cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,str_03);
      ::std::__cxx11::string::_M_append((char *)&url,(ulong)ps.hostname._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ps.hostname._M_dataplus._M_p != &ps.hostname.field_2) {
        operator_delete(ps.hostname._M_dataplus._M_p,ps.hostname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != local_578) {
        operator_delete(cb.
                        super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_578[0]._M_allocated_capacity + 1);
      }
      __cp = __cp + 1;
    } while (__cp != paVar6);
  }
  this_02 = (local_540->super_tracker_connection).m_req.ipv6.
            super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar7 = (local_540->super_tracker_connection).m_req.ipv6.
           super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_02 != paVar7 && !bVar13) {
    do {
      boost::asio::ip::address_v6::to_string_abi_cxx11_(&ps.hostname,this_02);
      ::std::__cxx11::string::append((char *)&url);
      str_04._M_str = (char *)in_RCX;
      str_04._M_len = (size_t)ps.hostname._M_dataplus._M_p;
      escape_string_abi_cxx11_((string *)&cb,(libtorrent *)ps.hostname._M_string_length,str_04);
      ::std::__cxx11::string::_M_append
                ((char *)&url,
                 (ulong)cb.
                        super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != local_578) {
        operator_delete(cb.
                        super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_578[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ps.hostname._M_dataplus._M_p != &ps.hostname.field_2) {
        operator_delete(ps.hostname._M_dataplus._M_p,ps.hostname.field_2._M_allocated_capacity + 1);
      }
      this_02 = this_02 + 1;
    } while (this_02 != paVar7);
  }
  phVar10 = local_540;
  if ((bVar13) ||
     ((p_Var8 = (local_540->super_tracker_connection).m_req.outgoing_socket.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi, p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
      (p_Var8->_M_use_count != 0)))) {
    __args = local_540->m_ioc;
    __args_1 = ((local_540->super_tracker_connection).m_man)->m_host_resolver;
    shared_from_this((http_tracker_connection *)&ls);
    ps.hostname._0_16_ = ZEXT816(0x213c1a);
    ps.hostname.field_2._M_allocated_capacity =
         (size_type)
         ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    ps.hostname.field_2._8_8_ =
         ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_589 = true;
    pmVar2 = &this_00->m_mutex;
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._0_1_ = 0;
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pmVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&cb);
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._0_1_ = 1;
    iVar22 = (this_00->m_store).m_ints._M_elems[0x73];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&cb);
    phVar10 = local_540;
    local_4ac = iVar22;
    shared_from_this((http_tracker_connection *)(auStack_450 + 8));
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)
         ZEXT816(0x2140d6);
    local_578[0]._M_allocated_capacity = auStack_450._8_8_;
    local_578[0]._8_8_ = _Stack_440._M_p;
    auStack_450._8_8_ = 0;
    _Stack_440._M_p = (pointer)0x0;
    shared_from_this((http_tracker_connection *)(local_468 + 0x10));
    bi.device._M_dataplus._M_p = (pointer)on_filter;
    bi.device._M_string_length = 0;
    bi.device.field_2._M_allocated_capacity = local_468._16_8_;
    bi.device.field_2._8_8_ = auStack_450._0_8_;
    local_468._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auStack_450._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    shared_from_this((http_tracker_connection *)local_468);
    user_agent._M_dataplus._M_p = (pointer)on_filter_hostname;
    user_agent._M_string_length = 0;
    user_agent.field_2._M_allocated_capacity = local_468._0_8_;
    user_agent.field_2._8_8_ = local_468._8_8_;
    local_468._0_8_ = (_func_int **)0x0;
    local_468._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_488._0_8_ = (http_connection *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libtorrent::aux::http_connection,std::allocator<libtorrent::aux::http_connection>,boost::asio::io_context&,libtorrent::aux::resolver_interface&,std::_Bind<void(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(boost::system::error_code_const&,libtorrent::aux::http_parser_const&,libtorrent::span<char_const>)>,bool,int,std::_Bind<void(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>))(libtorrent::aux::http_connection&)>,std::_Bind<void(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::aux::http_connection&,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>&)>,std::_Bind<bool(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::aux::http_connection&,std::basic_string_view<char,std::char_traits<char>>)>,boost::asio::ssl::context*const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_488 + 8),
               (http_connection **)local_488,
               (allocator<libtorrent::aux::http_connection> *)&local_531,__args,__args_1,
               (_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::span<const_char>)>
                *)&ps,&local_589,&local_4ac,
               (_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>))(libtorrent::aux::http_connection_&)>
                *)&cb,(_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                       *)&bi,
               (_Bind<bool_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)&user_agent,&(phVar10->super_tracker_connection).m_req.ssl_ctx);
    ::std::__shared_ptr<libtorrent::aux::http_connection,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<libtorrent::aux::http_connection,libtorrent::aux::http_connection>
              ((__shared_ptr<libtorrent::aux::http_connection,(__gnu_cxx::_Lock_policy)2> *)
               local_488,(http_connection *)local_488._0_8_);
    uVar12 = local_488._8_8_;
    uVar11 = local_488._0_8_;
    local_488._0_8_ = (http_connection *)0x0;
    local_488._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var8 = (phVar10->m_tracker_connection).
             super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (phVar10->m_tracker_connection).
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar11;
    (phVar10->m_tracker_connection).
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar12;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_);
    }
    if (user_agent.field_2._8_8_ != 0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)user_agent.field_2._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_);
    }
    if (bi.device.field_2._8_8_ != 0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bi.device.field_2._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_450._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_450._0_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578[0]._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578[0]._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_440._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_440._M_p);
    }
    if (ps.hostname.field_2._8_8_ != 0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ps.hostname.field_2._8_8_);
    }
    if (ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (ls.m_sock.
                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((phVar10->super_tracker_connection).m_req.event == stopped) {
      ps.hostname._M_string_length._0_1_ = 0;
      ps.hostname._M_dataplus._M_p = (pointer)pmVar2;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&ps);
      iVar22 = (this_00->m_store).m_ints._M_elems[2];
    }
    else {
      ps.hostname._M_string_length._0_1_ = 0;
      ps.hostname._M_dataplus._M_p = (pointer)pmVar2;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&ps);
      iVar22 = (this_00->m_store).m_ints._M_elems[0];
    }
    ps.hostname._M_string_length._0_1_ = 1;
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&ps);
    ps.hostname._M_string_length._0_1_ = 0;
    ps.hostname._M_dataplus._M_p = (pointer)pmVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&ps);
    ps.hostname._M_string_length._0_1_ = 1;
    uVar15 = (this_00->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&ps);
    if (((uVar15 >> 0x26 & 1) == 0) ||
       (((phVar10->super_tracker_connection).m_req.private_torrent & 1U) != 0)) {
      psVar19 = session_settings::get_str_abi_cxx11_(this_00,0);
      user_agent._M_dataplus._M_p = (pointer)&user_agent.field_2;
      pcVar4 = (psVar19->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&user_agent,pcVar4,pcVar4 + psVar19->_M_string_length);
    }
    else {
      user_agent._M_dataplus._M_p = (pointer)&user_agent.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&user_agent,"curl/7.81.0","");
    }
    ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (phVar10->super_tracker_connection).m_req.outgoing_socket.m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (phVar10->super_tracker_connection).m_req.outgoing_socket.m_sock.
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count =
             (ls.m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count =
             (ls.m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
    }
    plVar20 = listen_socket_handle::get(&ls);
    if (plVar20 == (listen_socket_t *)0x0) {
      bi.device._M_dataplus._M_p = (pointer)&bi.device.field_2;
      bi.device._M_string_length = 0;
      bi.device.field_2._M_allocated_capacity =
           bi.device.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bi.ip.type_ = ipv4;
      bi.ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      bi.ip.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      bi.ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      bi.ip.ipv6_address_.scope_id_ = 0;
    }
    else {
      listen_socket_handle::device_abi_cxx11_(&bi.device,&ls);
      listen_socket_handle::get_local_endpoint((endpoint *)&ps,&ls);
      if ((short)ps.hostname._M_dataplus._M_p == 2) {
        bi.ip._0_8_ = (ulong)ps.hostname._M_dataplus._M_p._4_4_ << 0x20;
        bi.ip.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        bi.ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        bi.ip.ipv6_address_.scope_id_ = 0;
      }
      else {
        bi.ip.ipv6_address_.addr_.__in6_u._0_8_ = ps.hostname._M_string_length;
        bi.ip.ipv6_address_.addr_.__in6_u._8_8_ = ps.hostname.field_2._M_allocated_capacity;
        bi.ip.ipv6_address_.scope_id_ = ps.hostname.field_2._8_8_ & 0xffffffff;
        bi.ip.type_ = ipv6;
        bi.ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      }
    }
    proxy_settings::proxy_settings(&ps,this_00);
    this_01 = (phVar10->m_tracker_connection).
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    ps_00 = (proxy_settings *)0x0;
    if (ps.proxy_tracker_connections != false) {
      ps_00 = &ps;
    }
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_578;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&cb,bi.device._M_dataplus._M_p,
               bi.device._M_dataplus._M_p + bi.device._M_string_length);
    local_578[1]._0_4_ = bi.ip.type_;
    local_578[1]._4_4_ = bi.ip.ipv4_address_.addr_.s_addr;
    local_578[1]._8_4_ = bi.ip.ipv6_address_.addr_.__in6_u.__u6_addr32[0];
    local_578[1]._12_4_ = bi.ip.ipv6_address_.addr_.__in6_u.__u6_addr32[1];
    local_578[2]._0_4_ = bi.ip.ipv6_address_.addr_.__in6_u.__u6_addr32[2];
    local_578[2]._4_4_ = bi.ip.ipv6_address_.addr_.__in6_u.__u6_addr32[3];
    local_578[2]._8_8_ = bi.ip.ipv6_address_.scope_id_;
    local_548 = true;
    eVar3 = (phVar10->super_tracker_connection).m_req.event;
    local_488._0_8_ = (http_connection *)(local_488 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"");
    http_connection::get
              (this_01,&url,(time_duration)((long)iVar22 * 1000000000),ps_00,5,&user_agent,
               (optional<libtorrent::aux::bind_info_t> *)&cb,(resolver_flags)(eVar3 == stopped | 2),
               (string *)local_488,(phVar10->super_tracker_connection).m_req.i2pconn);
    if ((http_connection *)local_488._0_8_ != (http_connection *)(local_488 + 0x10)) {
      operator_delete((void *)local_488._0_8_,(ulong)(local_488._16_8_ + 1));
    }
    phVar10 = local_540;
    if (local_548 == true) {
      local_548 = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != local_578) {
        operator_delete(cb.
                        super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_578[0]._M_allocated_capacity + 1);
      }
    }
    tracker_connection::sent_bytes
              (&phVar10->super_tracker_connection,(int)url._M_string_length + 100);
    tracker_connection::requester((tracker_connection *)&cb);
    if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->_vptr_request_callback[7])
                (cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,"==> TRACKER_REQUEST [ url: %s ]",url._M_dataplus._M_p);
    }
    if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ps.password._M_dataplus._M_p != &ps.password.field_2) {
      operator_delete(ps.password._M_dataplus._M_p,ps.password.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ps.username._M_dataplus._M_p != &ps.username.field_2) {
      operator_delete(ps.username._M_dataplus._M_p,
                      CONCAT71(ps.username.field_2._M_allocated_capacity._1_7_,
                               ps.username.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ps.hostname._M_dataplus._M_p != &ps.hostname.field_2) {
      operator_delete(ps.hostname._M_dataplus._M_p,ps.hostname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bi.device._M_dataplus._M_p != &bi.device.field_2) {
      operator_delete(bi.device._M_dataplus._M_p,bi.device.field_2._M_allocated_capacity + 1);
    }
    if (ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(ls.m_sock.
                   super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar22 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar22 = (ls.m_sock.
                  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_weak_count;
        (ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar22 + -1;
      }
      if (iVar22 == 1) {
        (*(ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)user_agent._M_dataplus._M_p != &user_agent.field_2) {
      operator_delete(user_agent._M_dataplus._M_p,user_agent.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ps.hostname._0_16_ = errors::make_error_code(invalid_listen_socket);
    tracker_connection::fail
              (&phVar10->super_tracker_connection,(error_code *)&ps,get_interface,
               "outgoing socket was closed",(seconds32)0x0,(seconds32)0x0);
  }
LAB_0021385f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)url._M_dataplus._M_p != &url.field_2) {
    operator_delete(url._M_dataplus._M_p,url.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void http_tracker_connection::start()
	{
		std::string url = tracker_req().url;

		if (tracker_req().kind & tracker_request::scrape_request)
		{
			// find and replace "announce" with "scrape"
			// in request

			std::size_t pos = url.find("announce");
			if (pos == std::string::npos)
			{
				fail(errors::scrape_not_available, operation_t::bittorrent);
				return;
			}
			url.replace(pos, 8, "scrape");
		}

#if TORRENT_USE_I2P
		bool const i2p = is_i2p_url(url);
#else
		static const bool i2p = false;
#endif

		aux::session_settings const& settings = m_man.settings();

		// if request-string already contains
		// some parameters, append an ampersand instead
		// of a question mark
		auto const arguments_start = url.find('?');
		if (arguments_start != std::string::npos)
		{
			// tracker URLs that come pre-baked with query string arguments will be
			// rejected when SSRF-mitigation is enabled
			bool const ssrf_mitigation = settings.get_bool(settings_pack::ssrf_mitigation);
			if (ssrf_mitigation && has_tracker_query_string(string_view(url).substr(arguments_start + 1)))
			{
				fail(errors::ssrf_mitigation, operation_t::bittorrent);
				return;
			}
			url += "&";
		}
		else
		{
			url += "?";
		}

		url += "info_hash=";
		url += lt::escape_string({tracker_req().info_hash.data(), 20});

		if (!(tracker_req().kind & tracker_request::scrape_request))
		{
			static aux::array<const char*, 4> const event_string{{{"completed", "started", "stopped", "paused"}}};

			char str[1024];
			std::snprintf(str, sizeof(str)
				, "&peer_id=%s"
				"&port=%d"
				"&uploaded=%" PRId64
				"&downloaded=%" PRId64
				"&left=%" PRId64
				"&corrupt=%" PRId64
				"&key=%08X"
				"%s%s" // event
				"&numwant=%d"
				"&compact=1"
				"&no_peer_id=1"
				, lt::escape_string({tracker_req().pid.data(), 20}).c_str()
				// the i2p tracker seems to verify that the port is not 0,
				// even though it ignores it otherwise
				, tracker_req().listen_port
				, tracker_req().uploaded
				, tracker_req().downloaded
				, tracker_req().left
				, tracker_req().corrupt
				, tracker_req().key
				, (tracker_req().event != event_t::none) ? "&event=" : ""
				, (tracker_req().event != event_t::none) ? event_string[static_cast<int>(tracker_req().event) - 1] : ""
				, tracker_req().num_want);
			url += str;
#if !defined TORRENT_DISABLE_ENCRYPTION
			if (settings.get_int(settings_pack::in_enc_policy) != settings_pack::pe_disabled
				&& settings.get_bool(settings_pack::announce_crypto_support))
				url += "&supportcrypto=1";
#endif
			if (settings.get_bool(settings_pack::report_redundant_bytes))
			{
				url += "&redundant=";
				url += to_string(tracker_req().redundant).data();
			}
			if (!tracker_req().trackerid.empty())
			{
				url += "&trackerid=";
				url += lt::escape_string(tracker_req().trackerid);
			}

#if TORRENT_USE_I2P
			if (i2p && tracker_req().i2pconn)
			{
				if (tracker_req().i2pconn->local_endpoint().empty())
				{
					fail(errors::no_i2p_endpoint, operation_t::bittorrent
						, "Waiting for i2p acceptor from SAM bridge", seconds32(5));
					return;
				}
				else
				{
					url += "&ip=" + tracker_req().i2pconn->local_endpoint () + ".i2p";
				}
			}
			else
#endif
			if (!settings.get_bool(settings_pack::anonymous_mode))
			{
				std::string const& announce_ip = settings.get_str(settings_pack::announce_ip);
				if (!announce_ip.empty())
				{
					url += "&ip=" + lt::escape_string(announce_ip);
				}
			}
		}

		if (!tracker_req().ipv4.empty() && !i2p)
		{
			for (auto const& v4 : tracker_req().ipv4)
			{
				std::string const ip = v4.to_string();
				url += "&ipv4=";
				url += lt::escape_string(ip);
			}
		}
		if (!tracker_req().ipv6.empty() && !i2p)
		{
			for (auto const& v6 : tracker_req().ipv6)
			{
				std::string const ip = v6.to_string();
				url += "&ipv6=";
				url += lt::escape_string(ip);
			}
		}

		// i2p trackers don't use our outgoing sockets, they use the SAM
		// connection
		if (!i2p && !tracker_req().outgoing_socket)
		{
			fail(errors::invalid_listen_socket, operation_t::get_interface
				, "outgoing socket was closed");
			return;
		}

		using namespace std::placeholders;
		m_tracker_connection = std::make_shared<aux::http_connection>(m_ioc, m_man.host_resolver()
			, std::bind(&http_tracker_connection::on_response, shared_from_this(), _1, _2, _3)
			, true, settings.get_int(settings_pack::max_http_recv_buffer_size)
			, std::bind(&http_tracker_connection::on_connect, shared_from_this(), _1)
			, std::bind(&http_tracker_connection::on_filter, shared_from_this(), _1, _2)
			, std::bind(&http_tracker_connection::on_filter_hostname, shared_from_this(), _1, _2)
#if TORRENT_USE_SSL
			, tracker_req().ssl_ctx
#endif
			);

		int const timeout = tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout);

		// in anonymous mode we omit the user agent to mitigate fingerprinting of
		// the client. Private torrents is an exception because some private
		// trackers may require the user agent
		bool const anon_user = settings.get_bool(settings_pack::anonymous_mode)
			&& !tracker_req().private_torrent;
		std::string const user_agent = anon_user
			? "curl/7.81.0"
			: settings.get_str(settings_pack::user_agent);

		auto const ls = bind_socket();
		bind_info_t bi = [&ls](){
			if (ls.get() == nullptr)
				return bind_info_t{};
			else
				return bind_info_t{ls.device(), ls.get_local_endpoint().address()};
		}();

		// when sending stopped requests, prefer the cached DNS entry
		// to avoid being blocked for slow or failing responses. Chances
		// are that we're shutting down, and this should be a best-effort
		// attempt. It's not worth stalling shutdown.
		aux::proxy_settings ps(settings);
		m_tracker_connection->get(url, seconds(timeout)
			, ps.proxy_tracker_connections ? &ps : nullptr
			, 5, user_agent, bi
			, (tracker_req().event == event_t::stopped
				? aux::resolver_interface::cache_only : aux::resolver_flags{})
				| aux::resolver_interface::abort_on_shutdown
#if TORRENT_ABI_VERSION == 1
			, tracker_req().auth
#else
			, ""
#endif
#if TORRENT_USE_I2P
			, tracker_req().i2pconn
#endif
			);

		// the url + 100 estimated header size
		sent_bytes(int(url.size()) + 100);

#ifndef TORRENT_DISABLE_LOGGING

		std::shared_ptr<request_callback> cb = requester();
		if (cb)
		{
			cb->debug_log("==> TRACKER_REQUEST [ url: %s ]", url.c_str());
		}
#endif
	}